

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O1

void whisper_kv_cache_seq_cp
               (whisper_kv_cache *cache,whisper_seq_id seq_id_src,whisper_seq_id seq_id_dst,
               whisper_pos p0,whisper_pos p1)

{
  pointer pwVar1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  ulong uVar6;
  int local_24;
  
  cache->head = 0;
  if (cache->size != 0) {
    uVar6 = 0;
    do {
      pwVar1 = (cache->cells).super__Vector_base<whisper_kv_cell,_std::allocator<whisper_kv_cell>_>.
               _M_impl.super__Vector_impl_data._M_start;
      p_Var3 = (_Rb_tree_header *)((long)&pwVar1[uVar6].seq_id._M_t._M_impl + 8);
      p_Var4 = (_Base_ptr)p_Var3;
      for (p_Var2 = *(_Base_ptr *)((long)&pwVar1[uVar6].seq_id._M_t._M_impl + 0x10);
          (_Rb_tree_header *)p_Var2 != (_Rb_tree_header *)0x0;
          p_Var2 = (&p_Var2->_M_left)[(int)*(size_t *)(p_Var2 + 1) < seq_id_src]) {
        if (seq_id_src <= (int)*(size_t *)(p_Var2 + 1)) {
          p_Var4 = p_Var2;
        }
      }
      p_Var5 = p_Var3;
      if (((_Rb_tree_header *)p_Var4 != p_Var3) &&
         (p_Var5 = (_Rb_tree_header *)p_Var4,
         seq_id_src < (int)((_Rb_tree_header *)p_Var4)->_M_node_count)) {
        p_Var5 = p_Var3;
      }
      if ((p_Var5 != p_Var3) && ((uint)pwVar1[uVar6].pos < 0x7fffffff)) {
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &pwVar1[uVar6].seq_id,&local_24);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < cache->size);
  }
  return;
}

Assistant:

static void whisper_kv_cache_seq_cp(
        struct whisper_kv_cache & cache,
                 whisper_seq_id   seq_id_src,
                 whisper_seq_id   seq_id_dst,
                    whisper_pos   p0,
                    whisper_pos   p1) {
    if (p0 < 0) p0 = 0;
    if (p1 < 0) p1 = std::numeric_limits<whisper_pos>::max();

    cache.head = 0;

    for (uint32_t i = 0; i < cache.size; ++i) {
        if (cache.cells[i].has_seq_id(seq_id_src) && cache.cells[i].pos >= p0 && cache.cells[i].pos < p1) {
            cache.cells[i].seq_id.insert(seq_id_dst);
        }
    }
}